

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::SetRawIssueAsset
          (ElementsTransactionApi *this,string *tx_hex,
          vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>
          *issuances,
          vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>
          *issuance_output)

{
  bool bVar1;
  undefined8 in_RCX;
  ConfidentialTransactionController *in_RDI;
  long in_R8;
  IssuanceOutput output;
  IssuanceParameter issuance_param;
  ByteData token_nonce;
  Script token_locking_script;
  ByteData asset_nonce;
  Script asset_locking_script;
  TxInIssuanceParameters *issuance;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>
  *__range2;
  ConfidentialTransactionController *ctxc;
  vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>
  *in_stack_fffffffffffffd48;
  IssuanceOutput *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  value_type *__x;
  ConfidentialTransactionController *in_stack_fffffffffffffd60;
  IssuanceOutput *this_00;
  Txid local_258;
  uint32_t local_238;
  BlindFactor local_230;
  ConfidentialAssetId local_210;
  ConfidentialAssetId local_1e8;
  BlindFactor local_1c0;
  ConfidentialAssetId local_1a0;
  ConfidentialAssetId local_178;
  undefined1 in_stack_fffffffffffffebd;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  Script *in_stack_fffffffffffffec0;
  Amount *in_stack_fffffffffffffec8;
  uint32_t in_stack_fffffffffffffed4;
  Txid *in_stack_fffffffffffffed8;
  ConfidentialTransactionController *in_stack_fffffffffffffee0;
  ByteData *in_stack_ffffffffffffff00;
  Amount *in_stack_ffffffffffffff08;
  pointer in_stack_ffffffffffffff10;
  pointer in_stack_ffffffffffffff18;
  ByteData256 *in_stack_ffffffffffffff28;
  ByteData local_b0;
  Script local_88;
  reference local_50;
  TxInIssuanceParameters *local_48;
  __normal_iterator<const_cfd::api::TxInIssuanceParameters_*,_std::vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>_>
  local_40;
  undefined8 local_38;
  undefined1 local_29;
  long local_28;
  undefined8 local_20;
  
  local_29 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  ConfidentialTransactionController::ConfidentialTransactionController
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  local_38 = local_20;
  local_40._M_current =
       (TxInIssuanceParameters *)
       std::
       vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>::
       begin(in_stack_fffffffffffffd48);
  local_48 = (TxInIssuanceParameters *)
             std::
             vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>
             ::end(in_stack_fffffffffffffd48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::TxInIssuanceParameters_*,_std::vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>_>
                             *)in_stack_fffffffffffffd50,
                            (__normal_iterator<const_cfd::api::TxInIssuanceParameters_*,_std::vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>_>
                             *)in_stack_fffffffffffffd48), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_cfd::api::TxInIssuanceParameters_*,_std::vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>_>
               ::operator*(&local_40);
    core::AbstractTxOut::GetLockingScript(&local_88,&(local_50->asset_txout).super_AbstractTxOut);
    core::ConfidentialTxOut::GetNonce
              ((ConfidentialNonce *)&stack0xffffffffffffff28,&local_50->asset_txout);
    core::ConfidentialNonce::GetData(&local_b0,(ConfidentialNonce *)&stack0xffffffffffffff28);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x562448);
    core::AbstractTxOut::GetLockingScript
              ((Script *)&stack0xfffffffffffffef0,&(local_50->token_txout).super_AbstractTxOut);
    core::ConfidentialTxOut::GetNonce
              ((ConfidentialNonce *)&stack0xfffffffffffffeb0,&local_50->token_txout);
    core::ConfidentialNonce::GetData
              ((ByteData *)&stack0xfffffffffffffed8,(ConfidentialNonce *)&stack0xfffffffffffffeb0);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5624a8);
    in_stack_fffffffffffffd50 = (IssuanceOutput *)&local_50->token_amount;
    this_00 = (IssuanceOutput *)&stack0xfffffffffffffed8;
    __x = (value_type *)&stack0xfffffffffffffef0;
    in_stack_fffffffffffffd48 =
         (vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>
          *)&local_b0;
    ConfidentialTransactionController::SetAssetIssuance
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_ffffffffffffff00,
               in_stack_ffffffffffffff08,(Script *)in_stack_ffffffffffffff10,
               (ByteData *)in_stack_ffffffffffffff18,(bool)in_stack_fffffffffffffebf,
               in_stack_ffffffffffffff28,(bool)in_stack_fffffffffffffebe,
               (bool)in_stack_fffffffffffffebd);
    if (local_28 != 0) {
      IssuanceOutput::IssuanceOutput(this_00);
      core::Txid::operator=(&local_258,&local_50->txid);
      local_238 = local_50->vout;
      core::ConfidentialAssetId::operator=(&local_210,&local_1a0);
      core::BlindFactor::operator=(&local_230,&local_1c0);
      core::ConfidentialAssetId::operator=(&local_1e8,&local_178);
      std::vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>::push_back
                ((vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *)
                 this_00,__x);
      IssuanceOutput::~IssuanceOutput(in_stack_fffffffffffffd50);
    }
    core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)in_stack_fffffffffffffd50);
    core::ByteData::~ByteData((ByteData *)0x5626fd);
    core::Script::~Script((Script *)in_stack_fffffffffffffd50);
    core::ByteData::~ByteData((ByteData *)0x562717);
    core::Script::~Script((Script *)in_stack_fffffffffffffd50);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::TxInIssuanceParameters_*,_std::vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>_>
    ::operator++(&local_40);
  }
  return in_RDI;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::SetRawIssueAsset(
    const std::string& tx_hex,
    const std::vector<TxInIssuanceParameters>& issuances,
    std::vector<IssuanceOutput>* issuance_output) {
  ConfidentialTransactionController ctxc(tx_hex);

  for (const auto& issuance : issuances) {
    Script asset_locking_script = issuance.asset_txout.GetLockingScript();
    ByteData asset_nonce = issuance.asset_txout.GetNonce().GetData();
    Script token_locking_script = issuance.token_txout.GetLockingScript();
    ByteData token_nonce = issuance.token_txout.GetNonce().GetData();

    IssuanceParameter issuance_param = ctxc.SetAssetIssuance(
        issuance.txid, issuance.vout, issuance.asset_amount,
        asset_locking_script, asset_nonce, issuance.token_amount,
        token_locking_script, token_nonce, issuance.is_blind,
        issuance.contract_hash, false);

    if (issuance_output != nullptr) {
      IssuanceOutput output;
      output.txid = issuance.txid;
      output.vout = issuance.vout;
      output.output.asset = issuance_param.asset;
      output.output.entropy = issuance_param.entropy;
      output.output.token = issuance_param.token;
      issuance_output->push_back(output);
    }
  }
  return ctxc;
}